

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteGenericLoop<duckdb::string_t,duckdb::string_t,bool,duckdb::BinaryStandardOperatorWrapper,duckdb::SuffixOperator,bool>
               (string_t *ldata,string_t *rdata,bool *result_data,SelectionVector *lsel,
               SelectionVector *rsel,idx_t count,ValidityMask *lvalidity,ValidityMask *rvalidity,
               ValidityMask *result_validity,bool fun)

{
  sel_t *psVar1;
  sel_t *psVar2;
  unsigned_long *puVar3;
  byte bVar4;
  long lVar5;
  undefined1 auVar6 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  TemplatedValidityData<unsigned_long> *pTVar8;
  _Head_base<0UL,_unsigned_long_*,_false> _Var9;
  ulong uVar10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var11;
  char *pcVar12;
  idx_t idx_in_entry;
  ulong uVar13;
  bool bVar14;
  char *pcVar15;
  uint uVar16;
  ulong uVar17;
  undefined1 local_68 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_60;
  undefined8 local_58;
  char *local_50;
  bool *local_48;
  buffer_ptr<ValidityBuffer> *local_40;
  ulong local_38;
  
  local_48 = result_data;
  if ((rvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0
      && (lvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
         (unsigned_long *)0x0) {
    if (count != 0) {
      psVar1 = lsel->sel_vector;
      psVar2 = rsel->sel_vector;
      uVar13 = 0;
      do {
        uVar10 = uVar13;
        if (psVar1 != (sel_t *)0x0) {
          uVar10 = (ulong)psVar1[uVar13];
        }
        uVar17 = uVar13;
        if (psVar2 != (sel_t *)0x0) {
          uVar17 = (ulong)psVar2[uVar13];
        }
        p_Stack_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ldata[uVar10].value.pointer.ptr
        ;
        local_58 = *(idx_t *)&rdata[uVar17].value;
        local_50 = rdata[uVar17].value.pointer.ptr;
        uVar16 = (uint)*(ulong *)&ldata[uVar10].value;
        if ((uint)local_58 <= uVar16) {
          if ((uint)local_58 < 0xd) {
            local_50 = (char *)((long)&local_58 + 4);
          }
          if (uVar16 < 0xd) {
            p_Stack_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_68 + 4);
          }
          uVar17 = local_58 & 0xffffffff;
          pcVar15 = (char *)((long)p_Stack_60 + (*(ulong *)&ldata[uVar10].value & 0xffffffff));
          do {
            pcVar15 = pcVar15 + -1;
            if ((int)uVar17 < 1) {
              bVar14 = true;
              goto LAB_0110ec2e;
            }
            lVar5 = uVar17 - 1;
            uVar17 = uVar17 - 1;
          } while (local_50[lVar5] == *pcVar15);
        }
        bVar14 = false;
LAB_0110ec2e:
        result_data[uVar13] = bVar14;
        uVar13 = uVar13 + 1;
      } while (uVar13 != count);
    }
  }
  else if (count != 0) {
    psVar1 = lsel->sel_vector;
    psVar2 = rsel->sel_vector;
    local_40 = &(result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data;
    uVar13 = 0;
    local_38 = count;
    do {
      uVar10 = uVar13;
      if (psVar1 != (sel_t *)0x0) {
        uVar10 = (ulong)psVar1[uVar13];
      }
      uVar17 = uVar13;
      if (psVar2 != (sel_t *)0x0) {
        uVar17 = (ulong)psVar2[uVar13];
      }
      puVar3 = (lvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (((puVar3 == (unsigned_long *)0x0) || ((puVar3[uVar10 >> 6] >> (uVar10 & 0x3f) & 1) != 0))
         && ((puVar3 = (rvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask,
             puVar3 == (unsigned_long *)0x0 || ((puVar3[uVar17 >> 6] >> (uVar17 & 0x3f) & 1) != 0)))
         ) {
        local_68 = *(undefined1 (*) [8])&ldata[uVar10].value;
        p_Stack_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ldata[uVar10].value.pointer.ptr
        ;
        local_58 = *(idx_t *)&rdata[uVar17].value;
        local_50 = rdata[uVar17].value.pointer.ptr;
        if ((uint)local_58 <= SUB84(local_68,0)) {
          pcVar15 = local_50;
          if ((uint)local_58 < 0xd) {
            pcVar15 = (char *)((long)&local_58 + 4);
          }
          p_Var11 = p_Stack_60;
          if (SUB84(local_68,0) < 0xd) {
            p_Var11 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_68 + 4);
          }
          uVar10 = local_58 & 0xffffffff;
          pcVar12 = (char *)((long)&p_Var11->_vptr__Sp_counted_base + ((ulong)local_68 & 0xffffffff)
                            );
          do {
            pcVar12 = pcVar12 + -1;
            if ((int)uVar10 < 1) {
              bVar14 = true;
              goto LAB_0110edc4;
            }
            lVar5 = uVar10 - 1;
            uVar10 = uVar10 - 1;
          } while (pcVar15[lVar5] == *pcVar12);
        }
        bVar14 = false;
LAB_0110edc4:
        local_48[uVar13] = bVar14;
      }
      else {
        _Var9._M_head_impl =
             (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if (_Var9._M_head_impl == (unsigned_long *)0x0) {
          local_58 = (result_validity->super_TemplatedValidityMask<unsigned_long>).capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_68,&local_58);
          p_Var7 = p_Stack_60;
          auVar6 = local_68;
          local_68 = (undefined1  [8])0x0;
          p_Stack_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          p_Var11 = (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.
                    internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
          (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)auVar6;
          (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = p_Var7;
          if ((p_Var11 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var11),
             p_Stack_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_60);
          }
          pTVar8 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                             (local_40);
          _Var9._M_head_impl =
               (pTVar8->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_mask =
               _Var9._M_head_impl;
          count = local_38;
        }
        bVar4 = (byte)uVar13 & 0x3f;
        _Var9._M_head_impl[uVar13 >> 6] =
             _Var9._M_head_impl[uVar13 >> 6] & (-2L << bVar4 | 0xfffffffffffffffeU >> 0x40 - bVar4);
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 != count);
  }
  return;
}

Assistant:

static void ExecuteGenericLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                               RESULT_TYPE *__restrict result_data, const SelectionVector *__restrict lsel,
	                               const SelectionVector *__restrict rsel, idx_t count, ValidityMask &lvalidity,
	                               ValidityMask &rvalidity, ValidityMask &result_validity, FUNC fun) {
		if (!lvalidity.AllValid() || !rvalidity.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto lindex = lsel->get_index(i);
				auto rindex = rsel->get_index(i);
				if (lvalidity.RowIsValid(lindex) && rvalidity.RowIsValid(rindex)) {
					auto lentry = ldata[lindex];
					auto rentry = rdata[rindex];
					result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
					    fun, lentry, rentry, result_validity, i);
				} else {
					result_validity.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[lsel->get_index(i)];
				auto rentry = rdata[rsel->get_index(i)];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, result_validity, i);
			}
		}
	}